

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)36,_(unsigned_short)7>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint *puVar2;
  
  puVar2 = *in;
  uVar1 = *puVar2;
  out[7] = (ulong)(uVar1 >> 0x1c);
  *in = puVar2 + 1;
  out[7] = (ulong)puVar2[1] << 4 | (ulong)(uVar1 >> 0x1c);
  *in = puVar2 + 2;
  uVar1 = puVar2[2];
  out[8] = (ulong)uVar1;
  *in = puVar2 + 3;
  out[8] = CONCAT44(puVar2[3],uVar1) & 0xfffffffff;
  Unroller<(unsigned_short)36,_(unsigned_short)9>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}